

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

void ImfFloatToHalfArray(int n,float *f,ImfHalf *h)

{
  ulong uVar1;
  ulong uVar2;
  half local_2a;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    Imath_3_2::half::half(&local_2a,f[uVar1]);
    h[uVar1] = local_2a._h;
  }
  return;
}

Assistant:

void
ImfFloatToHalfArray (int n, const float f[/*n*/], ImfHalf h[/*n*/])
{
    for (int i = 0; i < n; ++i)
        h[i] = half (f[i]).bits ();
}